

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O3

int __thiscall Itemset::compare(Itemset *this,Itemset *ar2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  peVar5 = (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = peVar5->theSize;
  peVar6 = (ar2->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = peVar6->theSize;
  uVar10 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar10 = uVar1;
  }
  if (0 < (int)uVar10) {
    peVar7 = (peVar5->theArray).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar8 = *(long *)&peVar7->super__Vector_base<int,_std::allocator<int>_>;
    uVar12 = (long)*(pointer *)((long)&peVar7->super__Vector_base<int,_std::allocator<int>_> + 8) -
             lVar8 >> 2;
    uVar13 = 0;
    do {
      uVar11 = uVar12;
      uVar14 = uVar12;
      if (uVar12 == uVar13) {
LAB_0011722b:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14,uVar11);
      }
      peVar7 = (peVar6->theArray).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar9 = *(long *)&peVar7->super__Vector_base<int,_std::allocator<int>_>;
      uVar11 = (long)*(pointer *)((long)&peVar7->super__Vector_base<int,_std::allocator<int>_> + 8)
               - lVar9 >> 2;
      uVar14 = uVar13;
      if (uVar11 <= uVar13) goto LAB_0011722b;
      iVar3 = *(int *)(lVar9 + uVar13 * 4);
      iVar4 = *(int *)(lVar8 + uVar13 * 4);
      if (iVar3 < iVar4) {
        return 1;
      }
      if (iVar4 < iVar3) {
        return 0xffffffff;
      }
      uVar13 = uVar13 + 1;
    } while (uVar10 != uVar13);
  }
  uVar10 = 0xffffffff;
  if ((int)uVar2 <= (int)uVar1) {
    uVar10 = (uint)((int)uVar2 < (int)uVar1);
  }
  return uVar10;
}

Assistant:

int Itemset::compare(Itemset &ar2) {
    int len;
    if (size() <= ar2.size()) len = size();
    else len = ar2.size();
    for (int i = 0; i < len; i++) {
        if ((*theItemset)[i] > (*ar2.theItemset)[i]) return 1;
        else if ((*theItemset)[i] < (*ar2.theItemset)[i]) return -1;
    }
    if (size() < ar2.size()) return -1;
    else if (size() > ar2.size()) return 1;
    else return 0;
}